

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileimagewindow.cc
# Opt level: O0

void __thiscall bgui::FileImageWindow::saveContent(FileImageWindow *this,char *basename)

{
  long lVar1;
  char *text;
  long lVar2;
  Image *pIVar3;
  char *in_RSI;
  BaseWindow *in_RDI;
  string name;
  size_t i;
  string base;
  long i1;
  long i0;
  long k1;
  long k0;
  ImageU8 image;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffffe08;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffffe10;
  long in_stack_fffffffffffffe18;
  allocator *paVar4;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffffe20;
  ImageU8 *in_stack_fffffffffffffe28;
  bool local_1b9;
  undefined6 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe56;
  undefined1 uVar5;
  char *__lhs;
  undefined2 uVar6;
  undefined6 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6e;
  bool bVar7;
  undefined1 uVar8;
  bool local_181;
  ImageU8 *in_stack_fffffffffffffe88;
  string local_160 [8];
  long in_stack_fffffffffffffea8;
  long in_stack_fffffffffffffeb0;
  long in_stack_fffffffffffffeb8;
  long in_stack_fffffffffffffec0;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffffec8;
  string local_120 [32];
  string local_100 [32];
  long local_e0;
  allocator local_d1;
  string local_d0 [88];
  long local_78;
  char *local_70;
  long local_68;
  long local_60;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> local_48;
  char *local_10;
  
  local_10 = in_RSI;
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(long)in_stack_fffffffffffffe10,
             (int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
  BaseWindow::getContent(in_RDI,in_stack_fffffffffffffe88);
  local_60 = 0;
  while( true ) {
    lVar2 = local_60;
    lVar1 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(&local_48);
    local_181 = false;
    if (lVar2 < lVar1) {
      local_181 = anon_unknown_8::isImageRowEmpty
                            (in_stack_fffffffffffffe28,(long)in_stack_fffffffffffffe20);
    }
    if (local_181 == false) break;
    local_60 = local_60 + 1;
  }
  local_68 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(&local_48)
  ;
  do {
    local_68 = local_68 + -1;
    bVar7 = false;
    if (-1 < local_68) {
      in_stack_fffffffffffffe6e =
           anon_unknown_8::isImageRowEmpty
                     (in_stack_fffffffffffffe28,(long)in_stack_fffffffffffffe20);
      bVar7 = (bool)in_stack_fffffffffffffe6e;
    }
  } while (bVar7 != false);
  local_70 = (char *)0x0;
  uVar8 = 0;
  while( true ) {
    __lhs = local_70;
    text = (char *)gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth
                             (&local_48);
    uVar5 = false;
    if ((long)__lhs < (long)text) {
      in_stack_fffffffffffffe56 =
           anon_unknown_8::isImageColumnEmpty
                     (in_stack_fffffffffffffe28,(long)in_stack_fffffffffffffe20);
      uVar5 = in_stack_fffffffffffffe56;
    }
    if ((bool)uVar5 == false) break;
    local_70 = local_70 + 1;
  }
  local_78 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(&local_48);
  do {
    local_78 = local_78 + -1;
    local_1b9 = false;
    if (-1 < local_78) {
      local_1b9 = anon_unknown_8::isImageColumnEmpty
                            (in_stack_fffffffffffffe28,(long)in_stack_fffffffffffffe20);
    }
  } while (local_1b9 != false);
  if ((local_78 < (long)local_70) || (local_68 < local_60)) {
    BaseWindow::setInfoLine
              ((BaseWindow *)
               CONCAT17(uVar8,CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)),text,
               SUB81((ulong)__lhs >> 0x38,0),SUB81((ulong)__lhs >> 0x30,0));
    goto LAB_001321df;
  }
  if ((((long)local_70 < 1) && (local_60 < 1)) &&
     (lVar2 = local_78 - (long)local_70,
     lVar1 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(&local_48),
     lVar1 <= lVar2 + 1)) {
    in_stack_fffffffffffffe20 =
         (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)((local_68 - local_60) + 1);
    lVar2 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(&local_48);
    if ((long)in_stack_fffffffffffffe20 < lVar2) goto LAB_00131ed7;
  }
  else {
LAB_00131ed7:
    gimage::cropImage<unsigned_char>
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::operator=
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
              (in_stack_fffffffffffffe20);
  }
  paVar4 = &local_d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,local_10,paVar4);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  local_e0 = std::__cxx11::string::rfind((char)local_d0,0x2e);
  if (local_e0 != -1) {
    std::__cxx11::string::substr((ulong)local_100,(ulong)local_d0);
    std::__cxx11::string::operator=(local_d0,local_100);
    std::__cxx11::string::~string(local_100);
  }
  std::__cxx11::string::string((string *)&stack0xfffffffffffffec0,local_d0);
  gimage::getNewImageName(local_120,&stack0xfffffffffffffec0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffec0);
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 0) {
    BaseWindow::setInfoLine
              ((BaseWindow *)
               CONCAT17(uVar8,CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)),text,
               SUB81((ulong)__lhs >> 0x38,0),SUB81((ulong)__lhs >> 0x30,0));
  }
  else {
    pIVar3 = (Image *)gimage::getImageIO();
    std::__cxx11::string::c_str();
    gimage::ImageIO::save(pIVar3,(char *)&local_48);
    std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffe56,in_stack_fffffffffffffe50
                                                )));
    uVar6 = (undefined2)((ulong)__lhs >> 0x30);
    std::__cxx11::string::c_str();
    BaseWindow::setInfoLine
              ((BaseWindow *)
               CONCAT17(uVar8,CONCAT16(in_stack_fffffffffffffe6e,in_stack_fffffffffffffe68)),text,
               SUB21((ushort)uVar6 >> 8,0),SUB21(uVar6,0));
    std::__cxx11::string::~string(local_160);
  }
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string(local_d0);
LAB_001321df:
  gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
            (in_stack_fffffffffffffe20);
  return;
}

Assistant:

void FileImageWindow::saveContent(const char *basename)
{
  gimage::ImageU8 image;

  getContent(image);

  // strip black borders from image

  long k0=0;

  while (k0 < image.getHeight() && isImageRowEmpty(image, k0))
  {
    k0++;
  }

  long k1=image.getHeight()-1;

  while (k1 >= 0 && isImageRowEmpty(image, k1))
  {
    k1--;
  }

  long i0=0;

  while (i0 < image.getWidth() && isImageColumnEmpty(image, i0))
  {
    i0++;
  }

  long i1=image.getWidth()-1;

  while (i1 >= 0 && isImageColumnEmpty(image, i1))
  {
    i1--;
  }

  if (i0 <= i1 && k0 <= k1)
  {
    if (i0 > 0 || k0 > 0 || i1-i0+1 < image.getWidth() ||
        k1-k0+1 < image.getHeight())
    {
      image=cropImage(image, i0, k0, i1-i0+1, k1-k0+1);
    }

    // find file name that is not used

    std::string base=basename;

    size_t i=base.rfind('.');

    if (i != base.npos)
    {
      base=base.substr(0, i);
    }

    std::string name=gimage::getNewImageName(base);

    if (name.size() > 0)
    {
      gimage::getImageIO().save(image, name.c_str());
      setInfoLine(("Saved as "+name).c_str());
    }
    else
    {
      setInfoLine("Sorry, cannot determine file name for storing image!");
    }
  }
  else
  {
    setInfoLine("Empty image!");
  }
}